

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O2

void notationDeclDebug(void *ctx,xmlChar *name,xmlChar *publicId,xmlChar *systemId)

{
  xmllintState *lint;
  
  *(int *)((long)ctx + 0x28) = *(int *)((long)ctx + 0x28) + 1;
  if (*(int *)((long)ctx + 0x3c) != 0) {
    return;
  }
  fprintf(_stdout,"SAX.notationDecl(%s, %s, %s)\n",name,publicId,systemId);
  return;
}

Assistant:

static void
notationDeclDebug(void *ctx, const xmlChar *name,
	     const xmlChar *publicId, const xmlChar *systemId)
{
    xmllintState *lint = ctx;

    lint->callbacks++;
    if (lint->noout)
	return;
    fprintf(stdout, "SAX.notationDecl(%s, %s, %s)\n",
            (char *) name, (char *) publicId, (char *) systemId);
}